

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_severity.cc
# Opt level: O3

ostream * absl::lts_20240722::operator<<(ostream *os,LogSeverityAtLeast s)

{
  ostream *poVar1;
  
  if (s < 4) {
    std::__ostream_insert<char,std::char_traits<char>>(os,">=",2);
    poVar1 = operator<<(os,s);
    return poVar1;
  }
  if (s == kInfinity) {
    std::__ostream_insert<char,std::char_traits<char>>(os,"INFINITY",8);
  }
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, absl::LogSeverityAtLeast s) {
  switch (s) {
    case absl::LogSeverityAtLeast::kInfo:
    case absl::LogSeverityAtLeast::kWarning:
    case absl::LogSeverityAtLeast::kError:
    case absl::LogSeverityAtLeast::kFatal:
      return os << ">=" << static_cast<absl::LogSeverity>(s);
    case absl::LogSeverityAtLeast::kInfinity:
      return os << "INFINITY";
  }
  return os;
}